

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_redand(BtorSimBitVector *bv)

{
  int iVar1;
  BtorSimBitVector *pBVar2;
  uint32_t uVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  
  pBVar2 = btorsim_bv_new(1);
  uVar4 = bv->len;
  uVar3 = 0xffffffff;
  if ((ulong)uVar4 << 5 != (ulong)bv->width) {
    uVar3 = 0x7fffffff >> (~(byte)bv->width & 0x1f);
  }
  bVar6 = bv[1].width == uVar3;
  if (bVar6 && 1 < (ulong)uVar4) {
    lVar5 = 3;
    do {
      bVar6 = (&bv->width)[lVar5] == 0xffffffff;
      if (!bVar6) break;
      iVar1 = (int)lVar5;
      lVar5 = lVar5 + 1;
    } while (iVar1 - 1U < uVar4);
  }
  uVar4 = pBVar2->len - 1;
  (&pBVar2[1].width)[uVar4] = (uint)bVar6 | (&pBVar2[1].width)[uVar4] & 0xfffffffe;
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_redand (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;
  uint32_t bit;
  uint32_t mask0;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  assert (rem_bits_zero_dbg (res));

  if (bv->width == BTORSIM_BV_TYPE_BW * bv->len)
    mask0 = ~(BTORSIM_BV_TYPE) 0;
  else
    mask0 = BTOR2_MASK_REM_BITS (bv);

  bit = (bv->bits[0] == mask0);

  for (i = 1; bit && i < bv->len; i++)
    if (bv->bits[i] != ~(BTORSIM_BV_TYPE) 0) bit = 0;

  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}